

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::Node(Node *this,StringPtr name,Which kind,Reader genericParams)

{
  uint uVar1;
  Which kind_local;
  Node *this_local;
  StringPtr name_local;
  
  Resolver::Resolver(&this->super_Resolver);
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_0039d5e0;
  this->module = (CompiledModule *)0x0;
  kj::Maybe<capnp::compiler::Compiler::Node_&>::Maybe(&this->parent);
  Declaration::Reader::Reader(&this->declaration);
  this->id = (ulong)(kind + 1000);
  (this->displayName).content.ptr = name.content.ptr;
  (this->displayName).content.size_ = name.content.size_;
  this->kind = kind;
  uVar1 = List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::size
                    (&genericParams);
  this->genericParamCount = uVar1;
  this->isBuiltin = true;
  this->startByte = 0;
  this->endByte = 0;
  Content::Content(&this->guardedContent);
  this->inGetContent = false;
  kj::Maybe<capnp::schema::Node::Reader>::Maybe(&this->loadedFinalSchema);
  return;
}

Assistant:

Compiler::Node::Node(kj::StringPtr name, Declaration::Which kind,
                     List<Declaration::BrandParameter>::Reader genericParams)
    : module(nullptr),
      parent(kj::none),
      // It's helpful if these have unique IDs. Real type IDs can't be under 2^31 anyway.
      id(1000 + static_cast<uint>(kind)),
      displayName(name),
      kind(kind),
      genericParamCount(genericParams.size()),
      isBuiltin(true),
      startByte(0),
      endByte(0) {}